

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

DaysInYear days_since_jan(long days)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long d;
  long lVar5;
  long lVar6;
  
  iVar1 = -0x7b2;
  uVar3 = 0x7b2;
  iVar2 = -0x7b1;
  do {
    lVar5 = days;
    lVar4 = 0x16d;
    if (((uVar3 & 3) == 0) && (lVar4 = 0x16e, (int)(uVar3 / 100) * 100 + iVar1 == 0)) {
      lVar4 = (ulong)((int)(uVar3 / 400) * 400 + iVar1 == 0) + 0x16d;
    }
    lVar6 = lVar4;
    if (lVar5 < lVar4) {
      lVar6 = 0;
    }
    iVar1 = iVar1 + -1;
    uVar3 = (ulong)((int)uVar3 + 1);
    iVar2 = iVar2 + -1;
    days = lVar5 - lVar6;
  } while (lVar4 <= lVar5);
  return (DaysInYear)((ulong)((uint)(lVar4 <= lVar5) - iVar2) | lVar5 - lVar6 << 0x20);
}

Assistant:

DaysInYear days_since_jan(long days)
{
	auto year = 1970;
	auto d{ days };
	while (true)
	{
		auto threshold = leapyear(year) ? 366 : 365;
		if (d < threshold)
			break;
		d -= threshold;
		++year;
	}
	return DaysInYear(year, d);
}